

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

int __thiscall CPU::instrASL0x0e(CPU *this)

{
  Memory *this_00;
  byte value;
  byte bVar1;
  uint16_t uVar2;
  
  uVar2 = this->PC;
  this->PC = uVar2 + 2;
  uVar2 = Memory::Read16(this->m,uVar2);
  this_00 = this->m;
  bVar1 = Memory::Read8(this_00,uVar2);
  value = bVar1 * '\x02';
  this->field_0x2e = bVar1 & 0x80 | value >> 7 | this->field_0x2e & 0x3e | (value == 0) << 6;
  Memory::Write8(this_00,uVar2,value);
  return 6;
}

Assistant:

int CPU::instrASL0x0e() {
	uint16_t address = absolute_addr_j();
	m->Write8(address, ASL(m->Read8(address)));
	return 6;
}